

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void ws_dialer_stop(void *arg)

{
  int iVar1;
  nni_ws_dialer *d;
  void *arg_local;
  
  ws_dialer_close(arg);
  nni_mtx_lock((nni_mtx *)((long)arg + 0x58));
  while( true ) {
    iVar1 = nni_list_empty((nni_list *)((long)arg + 200));
    if (iVar1 != 0) break;
    nni_cv_wait((nni_cv *)((long)arg + 0x80));
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x58));
  return;
}

Assistant:

static void
ws_dialer_stop(void *arg)
{
	nni_ws_dialer *d = arg;

	ws_dialer_close(d);
	nni_mtx_lock(&d->mtx);
	while (!nni_list_empty(&d->wspend)) {
		nni_cv_wait(&d->cv);
	}
	nni_mtx_unlock(&d->mtx);
}